

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_mul(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
                   _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *pmVar1;
  mbedtls_mpi *Y;
  mbedtls_mpi *pmVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  uchar swap;
  mbedtls_ecp_point *R_00;
  byte bVar12;
  uint uVar13;
  byte bVar14;
  size_t sVar15;
  ulong t_len;
  mbedtls_ecp_point *P_00;
  long lVar16;
  mbedtls_ecp_point *pmVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  mbedtls_ecp_point *local_2a8;
  byte local_298;
  mbedtls_mpi B;
  mbedtls_mpi E;
  mbedtls_mpi BB;
  mbedtls_mpi AA;
  mbedtls_mpi D;
  mbedtls_mpi local_1e0;
  mbedtls_mpi DA;
  mbedtls_mpi C;
  mbedtls_ecp_point RP;
  mbedtls_mpi local_90;
  mbedtls_mpi A;
  
  iVar5 = mbedtls_mpi_cmp_int(&P->Z,1);
  if (iVar5 != 0) {
    return -0x4f80;
  }
  iVar5 = mbedtls_ecp_check_privkey(grp,m);
  if (iVar5 != 0) {
    return iVar5;
  }
  iVar5 = mbedtls_ecp_check_pubkey(grp,P);
  if (iVar5 != 0) {
    return iVar5;
  }
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    mbedtls_ecp_point_init(&RP);
    mbedtls_mpi_init(&local_90);
    iVar5 = mbedtls_mpi_copy(&local_90,&P->X);
    if (((iVar5 == 0) && (iVar5 = mbedtls_ecp_copy(&RP,P), iVar5 == 0)) &&
       (iVar5 = mbedtls_mpi_lset(&R->X,1), iVar5 == 0)) {
      pmVar1 = &R->Z;
      iVar5 = mbedtls_mpi_lset(pmVar1,0);
      if (iVar5 == 0) {
        mbedtls_mpi_free(&R->Y);
        Y = &grp->P;
        do {
          iVar5 = mbedtls_mpi_cmp_mpi(&RP.X,Y);
          if (iVar5 < 0) {
            if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) goto LAB_0015593c;
            sVar8 = grp->pbits;
            mbedtls_mpi_init(&A);
            iVar6 = 0;
            goto LAB_00155774;
          }
          iVar5 = mbedtls_mpi_sub_abs(&RP.X,&RP.X,Y);
        } while (iVar5 == 0);
      }
    }
    goto LAB_0015584f;
  }
  mbedtls_mpi_init(&BB);
  mbedtls_mpi_init(&E);
  iVar5 = mbedtls_mpi_get_bit(&grp->N,0);
  if (iVar5 != 1) {
    return -0x4f80;
  }
  uVar7 = grp->nbits;
  iVar5 = mbedtls_mpi_cmp_mpi(&P->Y,&(grp->G).Y);
  if (iVar5 == 0) {
    iVar5 = mbedtls_mpi_cmp_mpi(&P->X,&(grp->G).X);
    bVar22 = iVar5 == 0;
  }
  else {
    bVar22 = false;
  }
  bVar12 = (0x17f < uVar7 | 4U) + bVar22;
  bVar10 = 2;
  if ((ulong)bVar12 < grp->nbits) {
    bVar10 = bVar12;
  }
  uVar13 = 1 << (bVar10 - 1 & 0x1f);
  uVar11 = (ulong)bVar10;
  uVar7 = ((grp->nbits + uVar11) - 1) / uVar11;
  local_298 = (byte)uVar13;
  if ((bVar22 == false) || (local_2a8 = grp->T, local_2a8 == (mbedtls_ecp_point *)0x0)) {
    local_2a8 = (mbedtls_ecp_point *)calloc((ulong)uVar13,0x48);
    if (local_2a8 == (mbedtls_ecp_point *)0x0) {
      iVar5 = -0x4d80;
      goto LAB_00155529;
    }
    iVar5 = mbedtls_ecp_copy(local_2a8,P);
    if (iVar5 == 0) {
      uVar20 = 0;
      uVar18 = 1;
      while( true ) {
        uVar18 = uVar18 & 0xff;
        t_len = uVar20 & 0xff;
        if (uVar13 <= (uint)uVar18) break;
        pmVar17 = local_2a8 + uVar18;
        iVar5 = mbedtls_ecp_copy(pmVar17,local_2a8 + (uVar18 >> 1));
        lVar16 = uVar7 + 1;
        while( true ) {
          if (iVar5 != 0) goto LAB_001554e6;
          lVar16 = lVar16 + -1;
          if (lVar16 == 0) break;
          iVar5 = ecp_double_jac(grp,pmVar17,pmVar17);
        }
        uVar20 = (ulong)((int)t_len + 1);
        *(mbedtls_ecp_point **)(&RP.X.s + t_len * 2) = pmVar17;
        uVar18 = (ulong)((uint)uVar18 * 2);
      }
      iVar5 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)&RP,t_len);
      if (iVar5 == 0) {
        bVar12 = 0;
        for (bVar10 = 1; bVar10 < local_298; bVar10 = bVar10 * '\x02') {
          uVar18 = (ulong)bVar10;
          pmVar17 = local_2a8 + uVar18;
          P_00 = local_2a8 + (uVar18 - 1);
          R_00 = local_2a8 + uVar18 * 2 + -1;
          while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
            iVar5 = ecp_add_mixed(grp,R_00,P_00,pmVar17);
            if (iVar5 != 0) goto LAB_001554e6;
            uVar20 = (ulong)bVar12;
            bVar12 = bVar12 + 1;
            *(mbedtls_ecp_point **)(&RP.X.s + uVar20 * 2) = R_00;
            P_00 = P_00 + -1;
            R_00 = R_00 + -1;
          }
        }
        iVar5 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)&RP,(ulong)bVar12);
        if (iVar5 == 0) {
          if (bVar22 != false) {
            grp->T = local_2a8;
            grp->T_size = (ulong)uVar13;
          }
          goto LAB_0015546a;
        }
      }
    }
  }
  else {
LAB_0015546a:
    iVar6 = mbedtls_mpi_get_bit(m,0);
    iVar5 = mbedtls_mpi_copy(&BB,m);
    if ((iVar5 == 0) && (iVar5 = mbedtls_mpi_sub_mpi(&E,&grp->N,m), iVar5 == 0)) {
      iVar5 = mbedtls_mpi_safe_cond_assign(&BB,&E,iVar6 != 1);
      if (iVar5 == 0) {
        memset(&RP,0,uVar7 + 1);
        for (uVar18 = 0; uVar18 != uVar7; uVar18 = uVar18 + 1) {
          for (uVar20 = 0; uVar11 != uVar20; uVar20 = uVar20 + 1) {
            iVar5 = mbedtls_mpi_get_bit(&BB,uVar20 * uVar7 + uVar18);
            pbVar3 = (byte *)((long)&RP.X.s + uVar18);
            *pbVar3 = *pbVar3 | (byte)(iVar5 << ((byte)uVar20 & 0x1f));
          }
        }
        bVar10 = 0;
        for (sVar15 = 1; uVar7 + 1 != sVar15; sVar15 = sVar15 + 1) {
          bVar12 = *(byte *)((long)&C.p + sVar15 + 7);
          bVar4 = *(byte *)((long)&RP.X.s + sVar15);
          bVar14 = bVar4 ^ bVar10;
          bVar9 = (~bVar14 & 1) * bVar12;
          bVar10 = bVar9 & bVar14 | bVar4 & bVar10;
          *(byte *)((long)&RP.X.s + sVar15) = bVar14 ^ bVar9;
          *(byte *)((long)&C.p + sVar15 + 7) = ~bVar14 << 7 | bVar12;
        }
        mbedtls_ecp_point_init((mbedtls_ecp_point *)&A);
        iVar5 = ecp_select_comb(grp,R,local_2a8,local_298,*(uchar *)((long)&RP.X.s + uVar7));
        if (iVar5 == 0) {
          pmVar1 = &R->Z;
          iVar5 = mbedtls_mpi_lset(pmVar1,1);
          if (iVar5 == 0) {
            if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
              sVar8 = grp->pbits;
              mbedtls_mpi_init(&AA);
              mbedtls_mpi_init(&B);
              iVar19 = 0;
              do {
                mbedtls_mpi_fill_random(&AA,sVar8 + 7 >> 3,f_rng,p_rng);
                while (iVar5 = mbedtls_mpi_cmp_mpi(&AA,&grp->P), -1 < iVar5) {
                  iVar5 = mbedtls_mpi_shift_r(&AA,1);
                  if (iVar5 != 0) goto LAB_00156164;
                }
                if (iVar19 == 0xb) {
                  iVar5 = -0x4d00;
                  goto LAB_0015571c;
                }
                iVar19 = iVar19 + 1;
                iVar5 = mbedtls_mpi_cmp_int(&AA,1);
              } while (iVar5 < 1);
              iVar5 = mbedtls_mpi_mul_mpi(pmVar1,pmVar1,&AA);
              if ((iVar5 == 0) && (iVar5 = ecp_modp(pmVar1,grp), iVar5 == 0)) {
                mul_count = mul_count + 1;
                iVar5 = mbedtls_mpi_mul_mpi(&B,&AA,&AA);
                if ((iVar5 == 0) && (iVar5 = ecp_modp(&B,grp), iVar5 == 0)) {
                  mul_count = mul_count + 1;
                  iVar5 = mbedtls_mpi_mul_mpi(&R->X,&R->X,&B);
                  if ((iVar5 == 0) && (iVar5 = ecp_modp(&R->X,grp), iVar5 == 0)) {
                    mul_count = mul_count + 1;
                    iVar5 = mbedtls_mpi_mul_mpi(&B,&B,&AA);
                    if ((iVar5 == 0) && (iVar5 = ecp_modp(&B,grp), iVar5 == 0)) {
                      mul_count = mul_count + 1;
                      pmVar1 = &R->Y;
                      iVar5 = mbedtls_mpi_mul_mpi(pmVar1,pmVar1,&B);
                      if ((iVar5 == 0) && (iVar5 = ecp_modp(pmVar1,grp), iVar5 == 0)) {
                        mul_count = mul_count + 1;
                        iVar5 = 0;
                      }
                    }
                  }
                }
              }
LAB_00156164:
              mbedtls_mpi_free(&AA);
              mbedtls_mpi_free(&B);
              if (iVar5 != 0) goto LAB_0015571c;
            }
            while (uVar7 != 0) {
              iVar5 = ecp_double_jac(grp,R,R);
              if (((iVar5 != 0) ||
                  (iVar5 = ecp_select_comb(grp,(mbedtls_ecp_point *)&A,local_2a8,local_298,
                                           *(uchar *)((long)&C.p + uVar7 + 7)), iVar5 != 0)) ||
                 (iVar5 = ecp_add_mixed(grp,R,R,(mbedtls_ecp_point *)&A), uVar7 = uVar7 - 1,
                 iVar5 != 0)) goto LAB_0015571c;
            }
            iVar5 = 0;
          }
        }
LAB_0015571c:
        mbedtls_ecp_point_free((mbedtls_ecp_point *)&A);
        if ((iVar5 == 0) && (iVar5 = ecp_safe_invert_jac(grp,R,iVar6 != 1), iVar5 == 0)) {
          iVar5 = ecp_normalize_jac(grp,R);
        }
      }
    }
  }
LAB_001554e6:
  if (bVar22 == false) {
    for (lVar16 = 0; (ulong)local_298 * 0x48 - lVar16 != 0; lVar16 = lVar16 + 0x48) {
      mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(local_2a8->X).s + lVar16));
    }
    free(local_2a8);
  }
LAB_00155529:
  mbedtls_mpi_free(&BB);
  mbedtls_mpi_free(&E);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    mbedtls_ecp_point_free(R);
  }
  return iVar5;
joined_r0x00155b67:
  if (iVar5 != 0) goto LAB_00155a5e;
  if ((-1 < B.s) || (iVar5 = mbedtls_mpi_cmp_int(&B,0), iVar5 == 0)) {
    iVar5 = mbedtls_mpi_mul_mpi(&BB,&B,&B);
    if ((iVar5 == 0) && (iVar5 = ecp_modp(&BB,grp), iVar5 == 0)) {
      mul_count = mul_count + 1;
      iVar5 = mbedtls_mpi_sub_mpi(&E,&AA,&BB);
      goto joined_r0x00155bf0;
    }
    goto LAB_00155a5e;
  }
  iVar5 = mbedtls_mpi_add_mpi(&B,&B,Y);
  goto joined_r0x00155b67;
joined_r0x00155bf0:
  if (iVar5 != 0) goto LAB_00155a5e;
  if ((-1 < E.s) || (iVar5 = mbedtls_mpi_cmp_int(&E,0), iVar5 == 0)) {
    iVar5 = mbedtls_mpi_add_mpi(&C,&RP.X,&RP.Z);
    goto joined_r0x00155c48;
  }
  iVar5 = mbedtls_mpi_add_mpi(&E,&E,Y);
  goto joined_r0x00155bf0;
joined_r0x00155c48:
  if (iVar5 != 0) goto LAB_00155a5e;
  iVar5 = mbedtls_mpi_cmp_mpi(&C,Y);
  if (iVar5 < 0) {
    iVar5 = mbedtls_mpi_sub_mpi(&D,&RP.X,&RP.Z);
    goto joined_r0x00155cac;
  }
  iVar5 = mbedtls_mpi_sub_abs(&C,&C,Y);
  goto joined_r0x00155c48;
joined_r0x00155cac:
  if (iVar5 != 0) goto LAB_00155a5e;
  if ((-1 < D.s) || (iVar5 = mbedtls_mpi_cmp_int(&D,0), iVar5 == 0)) {
    iVar5 = mbedtls_mpi_mul_mpi(&DA,&D,&A);
    if ((iVar5 == 0) && (iVar5 = ecp_modp(&DA,grp), iVar5 == 0)) {
      mul_count = mul_count + 1;
      iVar5 = mbedtls_mpi_mul_mpi(&local_1e0,&C,&B);
      if ((iVar5 == 0) && (iVar5 = ecp_modp(&local_1e0,grp), iVar5 == 0)) {
        mul_count = mul_count + 1;
        iVar5 = mbedtls_mpi_add_mpi(&RP.X,&DA,&local_1e0);
        if ((iVar5 == 0) && (iVar5 = ecp_modp(&RP.X,grp), iVar5 == 0)) {
          mul_count = mul_count + 1;
          iVar5 = mbedtls_mpi_mul_mpi(&RP.X,&RP.X,&RP.X);
          if ((iVar5 == 0) && (iVar5 = ecp_modp(&RP.X,grp), iVar5 == 0)) {
            mul_count = mul_count + 1;
            iVar5 = mbedtls_mpi_sub_mpi(&RP.Z,&DA,&local_1e0);
            goto joined_r0x00155e0f;
          }
        }
      }
    }
    goto LAB_00155a5e;
  }
  iVar5 = mbedtls_mpi_add_mpi(&D,&D,Y);
  goto joined_r0x00155cac;
joined_r0x00155e0f:
  if (iVar5 != 0) goto LAB_00155a5e;
  if ((-1 < RP.Z.s) || (iVar5 = mbedtls_mpi_cmp_int(&RP.Z,0), iVar5 == 0)) {
    pmVar2 = &RP.Z;
    iVar5 = mbedtls_mpi_mul_mpi(pmVar2,pmVar2,pmVar2);
    if ((iVar5 == 0) && (iVar5 = ecp_modp(&RP.Z,grp), iVar5 == 0)) {
      mul_count = mul_count + 1;
      iVar5 = mbedtls_mpi_mul_mpi(&RP.Z,&local_90,&RP.Z);
      if ((iVar5 == 0) && (iVar5 = ecp_modp(&RP.Z,grp), iVar5 == 0)) {
        mul_count = mul_count + 1;
        iVar5 = mbedtls_mpi_mul_mpi(&R->X,&AA,&BB);
        if ((iVar5 == 0) && (iVar5 = ecp_modp(&R->X,grp), iVar5 == 0)) {
          mul_count = mul_count + 1;
          iVar5 = mbedtls_mpi_mul_mpi(pmVar1,&grp->A,&E);
          if ((iVar5 == 0) && (iVar5 = ecp_modp(pmVar1,grp), iVar5 == 0)) {
            mul_count = mul_count + 1;
            iVar5 = mbedtls_mpi_add_mpi(pmVar1,&BB,pmVar1);
            goto joined_r0x00155f55;
          }
        }
      }
    }
    goto LAB_00155a5e;
  }
  iVar5 = mbedtls_mpi_add_mpi(&RP.Z,&RP.Z,Y);
  goto joined_r0x00155e0f;
joined_r0x00155f55:
  if (iVar5 != 0) goto LAB_00155a5e;
  iVar5 = mbedtls_mpi_cmp_mpi(pmVar1,Y);
  if (iVar5 < 0) {
    iVar5 = mbedtls_mpi_mul_mpi(pmVar1,&E,pmVar1);
    if ((iVar5 == 0) && (iVar5 = ecp_modp(pmVar1,grp), iVar5 == 0)) {
      mul_count = mul_count + 1;
      iVar5 = 0;
    }
    goto LAB_00155a5e;
  }
  iVar5 = mbedtls_mpi_sub_abs(pmVar1,pmVar1,Y);
  goto joined_r0x00155f55;
  while( true ) {
    iVar6 = iVar6 + 1;
    iVar5 = mbedtls_mpi_cmp_int(&A,1);
    if (0 < iVar5) break;
LAB_00155774:
    mbedtls_mpi_fill_random(&A,sVar8 + 7 >> 3,f_rng,p_rng);
    while (iVar5 = mbedtls_mpi_cmp_mpi(&A,Y), -1 < iVar5) {
      iVar5 = mbedtls_mpi_shift_r(&A,1);
      if (iVar5 != 0) goto LAB_00155835;
    }
    if (iVar6 == 0xb) {
      iVar5 = -0x4d00;
      goto LAB_0015584f;
    }
  }
  iVar5 = mbedtls_mpi_mul_mpi(&RP.X,&RP.X,&A);
  if ((iVar5 == 0) && (iVar5 = ecp_modp(&RP.X,grp), iVar5 == 0)) {
    mul_count = mul_count + 1;
    pmVar2 = &RP.Z;
    iVar5 = mbedtls_mpi_mul_mpi(pmVar2,pmVar2,&A);
    if ((iVar5 == 0) && (iVar5 = ecp_modp(pmVar2,grp), iVar5 == 0)) {
      mul_count = mul_count + 1;
      iVar5 = 0;
    }
  }
LAB_00155835:
  mbedtls_mpi_free(&A);
  if (iVar5 == 0) {
LAB_0015593c:
    sVar8 = mbedtls_mpi_bitlen(m);
    while (bVar22 = sVar8 != 0, sVar8 = sVar8 - 1, bVar22) {
      iVar5 = mbedtls_mpi_get_bit(m,sVar8);
      swap = (uchar)iVar5;
      iVar5 = mbedtls_mpi_safe_cond_swap(&R->X,&RP.X,swap);
      if ((iVar5 != 0) || (iVar5 = mbedtls_mpi_safe_cond_swap(pmVar1,&RP.Z,swap), iVar5 != 0))
      goto LAB_0015584f;
      mbedtls_mpi_init(&A);
      mbedtls_mpi_init(&AA);
      mbedtls_mpi_init(&B);
      mbedtls_mpi_init(&BB);
      mbedtls_mpi_init(&E);
      mbedtls_mpi_init(&C);
      mbedtls_mpi_init(&D);
      mbedtls_mpi_init(&DA);
      mbedtls_mpi_init(&local_1e0);
      iVar5 = mbedtls_mpi_add_mpi(&A,&R->X,pmVar1);
      while (iVar5 == 0) {
        iVar5 = mbedtls_mpi_cmp_mpi(&A,Y);
        if (iVar5 < 0) {
          iVar5 = mbedtls_mpi_mul_mpi(&AA,&A,&A);
          if ((iVar5 == 0) && (iVar5 = ecp_modp(&AA,grp), iVar5 == 0)) {
            mul_count = mul_count + 1;
            iVar5 = mbedtls_mpi_sub_mpi(&B,&R->X,pmVar1);
            goto joined_r0x00155b67;
          }
          break;
        }
        iVar5 = mbedtls_mpi_sub_abs(&A,&A,Y);
      }
LAB_00155a5e:
      mbedtls_mpi_free(&A);
      mbedtls_mpi_free(&AA);
      mbedtls_mpi_free(&B);
      mbedtls_mpi_free(&BB);
      mbedtls_mpi_free(&E);
      mbedtls_mpi_free(&C);
      mbedtls_mpi_free(&D);
      mbedtls_mpi_free(&DA);
      mbedtls_mpi_free(&local_1e0);
      if (((iVar5 != 0) || (iVar5 = mbedtls_mpi_safe_cond_swap(&R->X,&RP.X,swap), iVar5 != 0)) ||
         (iVar5 = mbedtls_mpi_safe_cond_swap(pmVar1,&RP.Z,swap), iVar5 != 0)) goto LAB_0015584f;
    }
    iVar5 = mbedtls_mpi_inv_mod(pmVar1,pmVar1,Y);
    if (((iVar5 == 0) && (iVar5 = mbedtls_mpi_mul_mpi(&R->X,&R->X,pmVar1), iVar5 == 0)) &&
       (iVar5 = ecp_modp(&R->X,grp), iVar5 == 0)) {
      mul_count = mul_count + 1;
      iVar5 = mbedtls_mpi_lset(pmVar1,1);
    }
  }
LAB_0015584f:
  mbedtls_ecp_point_free(&RP);
  mbedtls_mpi_free(&local_90);
  return iVar5;
}

Assistant:

int mbedtls_ecp_mul( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
             const mbedtls_mpi *m, const mbedtls_ecp_point *P,
             int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret;

    /* Common sanity checks */
    if( mbedtls_mpi_cmp_int( &P->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecp_check_privkey( grp, m ) ) != 0 ||
        ( ret = mbedtls_ecp_check_pubkey( grp, P ) ) != 0 )
        return( ret );

#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
        return( ecp_mul_mxz( grp, R, m, P, f_rng, p_rng ) );
#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
        return( ecp_mul_comb( grp, R, m, P, f_rng, p_rng ) );
#endif
    return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
}